

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

void lua_getfenv(lua_State *L,int idx)

{
  TValue *pTVar1;
  long lVar2;
  long lVar3;
  uint64_t uVar4;
  
  pTVar1 = index2adr(L,idx);
  lVar3 = pTVar1->it64 >> 0x2f;
  lVar2 = 0x10;
  if ((lVar3 != -0xd) && (lVar3 != -9)) {
    uVar4 = 0xffffffffffffffff;
    if (lVar3 != -7) goto LAB_0011cb35;
    lVar2 = 0x48;
  }
  uVar4 = *(ulong *)((pTVar1->it64 & 0x7fffffffffffU) + lVar2) | 0xfffa000000000000;
LAB_0011cb35:
  L->top->u64 = uVar4;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  if (pTVar1 + 1 < (TValue *)(L->maxstack).ptr64) {
    return;
  }
  lj_state_growstack1(L);
  return;
}

Assistant:

LUA_API void lua_getfenv(lua_State *L, int idx)
{
  cTValue *o = index2adr_check(L, idx);
  if (tvisfunc(o)) {
    settabV(L, L->top, tabref(funcV(o)->c.env));
  } else if (tvisudata(o)) {
    settabV(L, L->top, tabref(udataV(o)->env));
  } else if (tvisthread(o)) {
    settabV(L, L->top, tabref(threadV(o)->env));
  } else {
    setnilV(L->top);
  }
  incr_top(L);
}